

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::HierarchicalReference::Element>::
emplaceRealloc<slang::ast::GenerateBlockSymbol_const&,int&>
          (SmallVectorBase<slang::ast::HierarchicalReference::Element> *this,pointer pos,
          GenerateBlockSymbol *args,int *args_1)

{
  ulong uVar1;
  undefined8 *puVar2;
  Symbol *pSVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Element *__cur_1;
  pointer pEVar6;
  Element *this_00;
  pointer pEVar7;
  pointer pEVar8;
  pointer pEVar9;
  ulong uVar10;
  long lVar11;
  
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar10 = this->len + 1;
  uVar1 = this->cap;
  if (uVar10 < uVar1 * 2) {
    uVar10 = uVar1 * 2;
  }
  if (0x3ffffffffffffff - uVar1 < uVar1) {
    uVar10 = 0x3ffffffffffffff;
  }
  lVar11 = (long)pos - (long)this->data_;
  pEVar6 = (pointer)operator_new(uVar10 << 5);
  this_00 = (Element *)((long)pEVar6 + lVar11);
  ast::HierarchicalReference::Element::Element(this_00,&args->super_Symbol,*args_1);
  pEVar9 = this->data_;
  pEVar7 = pEVar9 + this->len;
  pEVar8 = pEVar6;
  if (pEVar7 == pos) {
    for (; pEVar9 != pos; pEVar9 = pEVar9 + 1) {
      pSVar3 = (pEVar9->symbol).ptr;
      uVar4 = *(undefined8 *)
               &(pEVar9->selector).
                super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                .super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                ._M_u;
      uVar5 = *(undefined8 *)
               ((long)&(pEVar9->selector).
                       super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       .
                       super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
               + 0x10);
      *(undefined8 *)
       ((long)&(pEVar8->selector).
               super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_> + 8)
           = *(undefined8 *)
              ((long)&(pEVar9->selector).
                      super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                      .
                      super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                      .
                      super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                      .
                      super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                      .
                      super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                      .
                      super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
              + 8);
      *(undefined8 *)
       ((long)&(pEVar8->selector).
               super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_> +
       0x10) = uVar5;
      (pEVar8->symbol).ptr = pSVar3;
      *(undefined8 *)
       &(pEVar8->selector).
        super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        .super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
        super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
        super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
        super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
        super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_> =
           uVar4;
      pEVar8 = pEVar8 + 1;
    }
  }
  else {
    for (; pEVar9 != pos; pEVar9 = pEVar9 + 1) {
      pSVar3 = (pEVar9->symbol).ptr;
      uVar4 = *(undefined8 *)
               &(pEVar9->selector).
                super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                .super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                ._M_u;
      uVar5 = *(undefined8 *)
               ((long)&(pEVar9->selector).
                       super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       .
                       super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
               + 0x10);
      *(undefined8 *)
       ((long)&(pEVar8->selector).
               super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_> + 8)
           = *(undefined8 *)
              ((long)&(pEVar9->selector).
                      super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                      .
                      super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                      .
                      super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                      .
                      super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                      .
                      super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                      .
                      super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
              + 8);
      *(undefined8 *)
       ((long)&(pEVar8->selector).
               super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_> +
       0x10) = uVar5;
      (pEVar8->symbol).ptr = pSVar3;
      *(undefined8 *)
       &(pEVar8->selector).
        super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        .super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
        super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
        super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
        super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
        super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_> =
           uVar4;
      pEVar8 = pEVar8 + 1;
    }
    puVar2 = (undefined8 *)((long)pEVar6 + lVar11);
    for (; pos != pEVar7; pos = pos + 1) {
      pSVar3 = (pos->symbol).ptr;
      uVar4 = *(undefined8 *)
               &(pos->selector).
                super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                .super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                ._M_u;
      uVar5 = *(undefined8 *)
               ((long)&(pos->selector).
                       super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       .
                       super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
               + 0x10);
      puVar2[6] = *(undefined8 *)
                   ((long)&(pos->selector).
                           super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                           .
                           super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                           .
                           super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                           .
                           super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                           .
                           super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                           .
                           super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                   + 8);
      puVar2[7] = uVar5;
      puVar2[4] = pSVar3;
      puVar2[5] = uVar4;
      puVar2 = puVar2 + 4;
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)args);
  this->len = this->len + 1;
  this->cap = uVar10;
  this->data_ = pEVar6;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}